

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalPartitionedAggregate::GetLocalSinkState
          (PhysicalPartitionedAggregate *this,ExecutionContext *context)

{
  PhysicalOperator *pPVar1;
  const_reference pvVar2;
  PartitionedAggregateLocalSinkState *this_00;
  ExecutionContext *in_RDX;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                      &context->pipeline,0);
  pPVar1 = pvVar2->_M_data;
  this_00 = (PartitionedAggregateLocalSinkState *)operator_new(0x120);
  PartitionedAggregateLocalSinkState::PartitionedAggregateLocalSinkState
            (this_00,(PhysicalPartitionedAggregate *)context,&pPVar1->types,in_RDX);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalPartitionedAggregate::GetLocalSinkState(ExecutionContext &context) const {
	D_ASSERT(sink_state);
	return make_uniq<PartitionedAggregateLocalSinkState>(*this, children[0].get().GetTypes(), context);
}